

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall imrt::Plan::Plan(Plan *this,Plan *p)

{
  _Rb_tree_header *p_Var1;
  Station *this_00;
  mapped_type *ppSVar2;
  _List_node_base *p_Var3;
  int local_64;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_40;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *local_38;
  
  this->_vptr_Plan = (_func_int **)&PTR__Plan_0013ac80;
  p_Var1 = &(this->angle2station)._M_t._M_impl.super__Rb_tree_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = &this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)local_38;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)local_38;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node._M_size = 0;
  this->last_changed = (Station *)0x0;
  local_60 = &this->angle2station;
  local_40 = &this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)local_40;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)local_40;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  this->ev = p->ev;
  std::vector<double,_std::allocator<double>_>::vector(&this->w,&p->w);
  local_48 = &this->w;
  std::vector<double,_std::allocator<double>_>::vector(&this->Zmin,&p->Zmin);
  local_58 = &this->Zmax;
  local_50 = &this->Zmin;
  std::vector<double,_std::allocator<double>_>::vector(local_58,&p->Zmax);
  p_Var3 = (_List_node_base *)&p->stations;
  while (p_Var3 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&p->stations) {
    this_00 = (Station *)operator_new(0x170);
    Station::Station(this_00,(Station *)p_Var3[1]._M_next);
    if ((p->last_changed != (Station *)0x0) && (p->last_changed->angle == this_00->angle)) {
      this->last_changed = this_00;
    }
    add_station(this,this_00);
    local_64 = this_00->angle;
    ppSVar2 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](local_60,&local_64);
    *ppSVar2 = this_00;
  }
  this->evaluation_fx = p->evaluation_fx;
  return;
}

Assistant:

Plan::Plan(const Plan &p): ev(p.ev), w(p.w), Zmin(p.Zmin), Zmax(p.Zmax), last_changed(NULL) {
    //EvaluationFunction aux_ev(p.ev);
    //ev=aux_ev;
    for (list<Station*>::const_iterator it=p.stations.begin();it!=p.stations.end();it++) {
      Station* aux = new Station(**it);
      if (p.last_changed && p.last_changed->getAngle()==aux->getAngle()) last_changed=aux;
      add_station(*aux);
      angle2station[aux->getAngle()]=aux;
      //real_stations.push_back(*aux);
    }
    evaluation_fx=p.evaluation_fx;
  }